

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O2

bool __thiscall Opcode::AABBTree::Build(AABBTree *this,AABBTreeBuilder *builder)

{
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  udword *puVar4;
  ulong *puVar5;
  udword i;
  ulong uVar6;
  long lVar7;
  
  if (builder != (AABBTreeBuilder *)0x0) {
    if (builder->mNbPrimitives == 0) {
      bVar3 = false;
    }
    else {
      Release(this);
      builder->mCount = 1;
      builder->mNbInvalidSplits = 0;
      uVar2 = builder->mNbPrimitives;
      puVar4 = (udword *)operator_new__((ulong)uVar2 * 4);
      this->mIndices = puVar4;
      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
        puVar4[uVar6] = (udword)uVar6;
      }
      (this->super_AABBTreeNode).mNodePrimitives = puVar4;
      (this->super_AABBTreeNode).mNbPrimitives = uVar2;
      if ((builder->mSettings).mLimit == 1) {
        uVar6 = (ulong)(uVar2 * 2 - 1);
        puVar5 = (ulong *)operator_new__(uVar6 * 0x30 | 8);
        *puVar5 = uVar6;
        lVar7 = 0;
        do {
          *(undefined4 *)((long)puVar5 + lVar7 + 0x30) = 0;
          puVar1 = (undefined8 *)((long)puVar5 + lVar7 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar7 = lVar7 + 0x30;
        } while ((ulong)(uVar2 * 2 - 2) * 0x30 + 0x30 != lVar7);
        this->mPool = (AABBTreeNode *)(puVar5 + 1);
        builder->mNodeBase = (AABBTreeNode *)(puVar5 + 1);
      }
      AABBTreeNode::_BuildHierarchy(&this->super_AABBTreeNode,builder);
      this->mTotalNbNodes = builder->mCount;
      bVar3 = true;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool AABBTree::Build(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder || !builder->mNbPrimitives)	return false;

	// Release previous tree
	Release();

	// Init stats
	builder->SetCount(1);
	builder->SetNbInvalidSplits(0);

	// Initialize indices. This list will be modified during build.
	mIndices = new udword[builder->mNbPrimitives];
	CHECKALLOC(mIndices);
	// Identity permutation
	for(udword i=0;i<builder->mNbPrimitives;i++)	mIndices[i] = i;

	// Setup initial node. Here we have a complete permutation of the app's primitives.
	mNodePrimitives	= mIndices;
	mNbPrimitives	= builder->mNbPrimitives;

	// Use a linear array for complete trees (since we can predict the final number of nodes) [Opcode 1.3]
//	if(builder->mRules&SPLIT_COMPLETE)
	if(builder->mSettings.mLimit==1)
	{
		// Allocate a pool of nodes
		mPool = new AABBTreeNode[builder->mNbPrimitives*2 - 1];

		builder->mNodeBase = mPool;	// ### ugly !
	}

	// Build the hierarchy
	_BuildHierarchy(builder);

	// Get back total number of nodes
	mTotalNbNodes	= builder->GetCount();

	// For complete trees, check the correct number of nodes has been created [Opcode 1.3]
	if(mPool)	ASSERT(mTotalNbNodes==builder->mNbPrimitives*2 - 1);

	return true;
}